

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  ushort uVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [40];
  undefined1 auVar135 [48];
  undefined1 auVar136 [56];
  undefined1 auVar137 [40];
  undefined1 auVar138 [48];
  undefined1 auVar139 [56];
  undefined1 auVar140 [24];
  int iVar141;
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar147 [32];
  undefined1 auVar151 [32];
  __m128 _outp_2;
  __m128 _p_2;
  __m128 _b;
  __m256 _outp_1;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _outp;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  int size;
  binary_op_pow op;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx;
  __m512 tmp_1;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 pow2n_1;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_3;
  __m256i imm0_3;
  __m256 fx_1;
  __m256 tmp_3;
  __m256 y_2;
  __m256 z_1;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_2;
  __m256i imm0_2;
  v4sf pow2n_2;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_2;
  v4sf tmp_5;
  v4sf y_4;
  v4sf z_2;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_4;
  v4si emm0;
  int local_45f4;
  undefined8 *local_45e0;
  undefined1 (*local_45d0) [64];
  undefined1 local_4280 [8];
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 uStack_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined1 local_4180 [16];
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 uStack_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined1 local_3e40 [256];
  undefined1 local_3d40 [16];
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 uStack_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined1 local_3c40 [16];
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 uStack_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  int local_2a80;
  int iStack_2a7c;
  int iStack_2a78;
  int iStack_2a74;
  int iStack_2a70;
  int iStack_2a6c;
  int iStack_2a68;
  int iStack_2a64;
  int iStack_2a60;
  int iStack_2a5c;
  int iStack_2a58;
  int iStack_2a54;
  int iStack_2a50;
  int iStack_2a4c;
  int iStack_2a48;
  int iStack_2a44;
  int local_2900;
  int iStack_28fc;
  int iStack_28f8;
  int iStack_28f4;
  int iStack_28f0;
  int iStack_28ec;
  int iStack_28e8;
  int iStack_28e4;
  int iStack_28e0;
  int iStack_28dc;
  int iStack_28d8;
  int iStack_28d4;
  int iStack_28d0;
  int iStack_28cc;
  int iStack_28c8;
  int iStack_28c4;
  int local_2040;
  int iStack_203c;
  int iStack_2038;
  int iStack_2034;
  int iStack_2030;
  int iStack_202c;
  int iStack_2028;
  int iStack_2024;
  int iStack_2020;
  int iStack_201c;
  int iStack_2018;
  int iStack_2014;
  int iStack_2010;
  int iStack_200c;
  int iStack_2008;
  int iStack_2004;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  float local_1f00;
  float fStack_1efc;
  float fStack_1ef8;
  float fStack_1ef4;
  float fStack_1ef0;
  float fStack_1eec;
  float fStack_1ee8;
  undefined4 uStack_1ee4;
  undefined1 local_1ec0 [8];
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1e60 [16];
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e20 [8];
  float fStack_1e18;
  float fStack_1e14;
  undefined1 local_1e00 [8];
  float fStack_1df8;
  float fStack_1df4;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  float local_1dc0;
  float fStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float local_1d00;
  float fStack_1cfc;
  float fStack_1cf8;
  float fStack_1cf4;
  undefined1 local_1c60 [8];
  float fStack_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float fStack_1c48;
  undefined4 uStack_1c44;
  undefined1 local_1be0 [8];
  float fStack_1bd8;
  float fStack_1bd4;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined1 local_1b60 [8];
  float fStack_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float fStack_1b4c;
  float fStack_1b48;
  float fStack_1b44;
  float local_1b40;
  float fStack_1b3c;
  float fStack_1b38;
  float fStack_1b34;
  float local_1b00;
  float fStack_1afc;
  float fStack_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  float fStack_1a88;
  float fStack_1a84;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  undefined1 local_af0 [8];
  undefined8 uStack_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined8 local_a90;
  undefined8 uStack_a88;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  
  iVar141 = in_ECX * in_R8D;
  local_45f4 = 0;
  auVar142 = vbroadcastss_avx512f(ZEXT416((uint)*in_RSI));
  local_45e0 = in_RDX;
  local_45d0 = in_RDI;
  for (; local_45f4 + 0xf < iVar141; local_45f4 = local_45f4 + 0x10) {
    uVar23 = vcmpps_avx512f(*local_45d0,ZEXT1664(ZEXT816(0)),2);
    auVar33._8_4_ = 0x800000;
    auVar33._12_4_ = 0x800000;
    auVar33._0_4_ = 0x800000;
    auVar33._4_4_ = 0x800000;
    auVar33._16_4_ = 0x800000;
    auVar33._20_4_ = 0x800000;
    auVar33._24_4_ = 0x800000;
    auVar33._28_4_ = 0x800000;
    auVar33._32_4_ = 0x800000;
    auVar33._36_4_ = 0x800000;
    auVar33._40_4_ = 0x800000;
    auVar33._44_4_ = 0x800000;
    auVar33._48_4_ = 0x800000;
    auVar33._52_4_ = 0x800000;
    auVar33._56_4_ = 0x800000;
    auVar33._60_4_ = 0x800000;
    auVar143 = vmaxps_avx512f(*local_45d0,auVar33);
    auVar144 = vmovdqa64_avx512f(auVar143);
    auVar144 = vpsrld_avx512f(auVar144,ZEXT416(0x17));
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar143 = vmovdqa64_avx512f(auVar143);
    auVar71._8_4_ = -0x7f800001;
    auVar71._12_4_ = -0x7f800001;
    auVar71._0_4_ = -0x7f800001;
    auVar71._4_4_ = -0x7f800001;
    auVar71._16_4_ = -0x7f800001;
    auVar71._20_4_ = -0x7f800001;
    auVar71._24_4_ = -0x7f800001;
    auVar71._28_4_ = -0x7f800001;
    auVar71._32_4_ = -0x7f800001;
    auVar71._36_4_ = -0x7f800001;
    auVar71._40_4_ = -0x7f800001;
    auVar71._44_4_ = -0x7f800001;
    auVar71._48_4_ = -0x7f800001;
    auVar71._52_4_ = -0x7f800001;
    auVar71._56_4_ = -0x7f800001;
    auVar71._60_4_ = -0x7f800001;
    auVar145 = vmovdqa64_avx512f(auVar71);
    auVar143 = vpandd_avx512f(auVar143,auVar145);
    auVar143 = vmovdqa64_avx512f(auVar143);
    auVar143 = vmovdqa64_avx512f(auVar143);
    auVar72._8_4_ = 0.5;
    auVar72._12_4_ = 0.5;
    auVar72._0_4_ = 0.5;
    auVar72._4_4_ = 0.5;
    auVar72._16_4_ = 0.5;
    auVar72._20_4_ = 0.5;
    auVar72._24_4_ = 0.5;
    auVar72._28_4_ = 0.5;
    auVar72._32_4_ = 0.5;
    auVar72._36_4_ = 0.5;
    auVar72._40_4_ = 0.5;
    auVar72._44_4_ = 0.5;
    auVar72._48_4_ = 0.5;
    auVar72._52_4_ = 0.5;
    auVar72._56_4_ = 0.5;
    auVar72._60_4_ = 0.5;
    auVar145 = vmovdqa64_avx512f(auVar72);
    auVar143 = vpord_avx512f(auVar143,auVar145);
    auVar143 = vmovdqa64_avx512f(auVar143);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar145 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar145 = vmovdqa64_avx512f(auVar145);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar145 = vmovdqa64_avx512f(auVar145);
    auVar144 = vpsubd_avx512f(auVar144,auVar145);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vcvtdq2ps_avx512f(auVar144);
    auVar28._8_4_ = 1.0;
    auVar28._12_4_ = 1.0;
    auVar28._0_4_ = 1.0;
    auVar28._4_4_ = 1.0;
    auVar28._16_4_ = 1.0;
    auVar28._20_4_ = 1.0;
    auVar28._24_4_ = 1.0;
    auVar28._28_4_ = 1.0;
    auVar28._32_4_ = 1.0;
    auVar28._36_4_ = 1.0;
    auVar28._40_4_ = 1.0;
    auVar28._44_4_ = 1.0;
    auVar28._48_4_ = 1.0;
    auVar28._52_4_ = 1.0;
    auVar28._56_4_ = 1.0;
    auVar28._60_4_ = 1.0;
    auVar144 = vaddps_avx512f(auVar144,auVar28);
    uVar24 = vcmpps_avx512f(auVar143,(undefined1  [64])_ps512_cephes_SQRTHF,1);
    uVar26 = (ushort)uVar24;
    auVar29._8_4_ = 1.0;
    auVar29._12_4_ = 1.0;
    auVar29._0_4_ = 1.0;
    auVar29._4_4_ = 1.0;
    auVar29._16_4_ = 1.0;
    auVar29._20_4_ = 1.0;
    auVar29._24_4_ = 1.0;
    auVar29._28_4_ = 1.0;
    auVar29._32_4_ = 1.0;
    auVar29._36_4_ = 1.0;
    auVar29._40_4_ = 1.0;
    auVar29._44_4_ = 1.0;
    auVar29._48_4_ = 1.0;
    auVar29._52_4_ = 1.0;
    auVar29._56_4_ = 1.0;
    auVar29._60_4_ = 1.0;
    auVar145 = vsubps_avx512f(auVar143,auVar29);
    auVar63._8_4_ = 1.0;
    auVar63._12_4_ = 1.0;
    auVar63._0_4_ = 1.0;
    auVar63._4_4_ = 1.0;
    auVar63._16_4_ = 1.0;
    auVar63._20_4_ = 1.0;
    auVar63._24_4_ = 1.0;
    auVar63._28_4_ = 1.0;
    auVar63._32_4_ = 1.0;
    auVar63._36_4_ = 1.0;
    auVar63._40_4_ = 1.0;
    auVar63._44_4_ = 1.0;
    auVar63._48_4_ = 1.0;
    auVar63._52_4_ = 1.0;
    auVar63._56_4_ = 1.0;
    auVar63._60_4_ = 1.0;
    local_2a80 = auVar144._0_4_;
    iStack_2a7c = auVar144._4_4_;
    iStack_2a78 = auVar144._8_4_;
    iStack_2a74 = auVar144._12_4_;
    iStack_2a70 = auVar144._16_4_;
    iStack_2a6c = auVar144._20_4_;
    iStack_2a68 = auVar144._24_4_;
    iStack_2a64 = auVar144._28_4_;
    iStack_2a60 = auVar144._32_4_;
    iStack_2a5c = auVar144._36_4_;
    iStack_2a58 = auVar144._40_4_;
    iStack_2a54 = auVar144._44_4_;
    iStack_2a50 = auVar144._48_4_;
    iStack_2a4c = auVar144._52_4_;
    iStack_2a48 = auVar144._56_4_;
    iStack_2a44 = auVar144._60_4_;
    auVar144 = vsubps_avx512f(auVar144,auVar63);
    bVar2 = (bool)((byte)uVar24 & 1);
    bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
    bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
    bVar10 = (byte)((ulong)uVar24 >> 8);
    bVar11 = (bool)(bVar10 >> 1 & 1);
    bVar12 = (bool)(bVar10 >> 2 & 1);
    bVar13 = (bool)(bVar10 >> 3 & 1);
    bVar14 = (bool)(bVar10 >> 4 & 1);
    bVar15 = (bool)(bVar10 >> 5 & 1);
    bVar16 = (bool)(bVar10 >> 6 & 1);
    local_3d40._4_4_ = (uint)bVar3 * auVar144._4_4_ | (uint)!bVar3 * iStack_2a7c;
    local_3d40._0_4_ = (uint)bVar2 * auVar144._0_4_ | (uint)!bVar2 * local_2a80;
    local_3d40._8_4_ = (uint)bVar4 * auVar144._8_4_ | (uint)!bVar4 * iStack_2a78;
    local_3d40._12_4_ = (uint)bVar5 * auVar144._12_4_ | (uint)!bVar5 * iStack_2a74;
    uStack_3d30._0_4_ = (uint)bVar6 * auVar144._16_4_ | (uint)!bVar6 * iStack_2a70;
    uStack_3d30._4_4_ = (uint)bVar7 * auVar144._20_4_ | (uint)!bVar7 * iStack_2a6c;
    uStack_3d28._0_4_ = (uint)bVar8 * auVar144._24_4_ | (uint)!bVar8 * iStack_2a68;
    uStack_3d28._4_4_ = (uint)bVar9 * auVar144._28_4_ | (uint)!bVar9 * iStack_2a64;
    auVar17 = _local_3d40;
    uStack_3d20._0_4_ =
         (uint)(bVar10 & 1) * auVar144._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_2a60;
    uStack_3d20._4_4_ = (uint)bVar11 * auVar144._36_4_ | (uint)!bVar11 * iStack_2a5c;
    auVar134 = _local_3d40;
    uStack_3d18._0_4_ = (uint)bVar12 * auVar144._40_4_ | (uint)!bVar12 * iStack_2a58;
    uStack_3d18._4_4_ = (uint)bVar13 * auVar144._44_4_ | (uint)!bVar13 * iStack_2a54;
    auVar135 = _local_3d40;
    uStack_3d10._0_4_ = (uint)bVar14 * auVar144._48_4_ | (uint)!bVar14 * iStack_2a50;
    uStack_3d10._4_4_ = (uint)bVar15 * auVar144._52_4_ | (uint)!bVar15 * iStack_2a4c;
    auVar136 = _local_3d40;
    uStack_3d08._0_4_ = (uint)bVar16 * auVar144._56_4_ | (uint)!bVar16 * iStack_2a48;
    uStack_3d08._4_4_ =
         (uint)(bVar10 >> 7) * auVar144._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_2a44;
    auVar144 = _local_3d40;
    local_2040 = auVar145._0_4_;
    iStack_203c = auVar145._4_4_;
    iStack_2038 = auVar145._8_4_;
    iStack_2034 = auVar145._12_4_;
    iStack_2030 = auVar145._16_4_;
    iStack_202c = auVar145._20_4_;
    iStack_2028 = auVar145._24_4_;
    iStack_2024 = auVar145._28_4_;
    iStack_2020 = auVar145._32_4_;
    iStack_201c = auVar145._36_4_;
    iStack_2018 = auVar145._40_4_;
    iStack_2014 = auVar145._44_4_;
    iStack_2010 = auVar145._48_4_;
    iStack_200c = auVar145._52_4_;
    iStack_2008 = auVar145._56_4_;
    iStack_2004 = auVar145._60_4_;
    auVar143 = vaddps_avx512f(auVar145,auVar143);
    bVar2 = (bool)((byte)uVar24 & 1);
    bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
    bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
    bVar11 = (bool)(bVar10 >> 1 & 1);
    bVar12 = (bool)(bVar10 >> 2 & 1);
    bVar13 = (bool)(bVar10 >> 3 & 1);
    bVar14 = (bool)(bVar10 >> 4 & 1);
    bVar15 = (bool)(bVar10 >> 5 & 1);
    bVar16 = (bool)(bVar10 >> 6 & 1);
    local_3c40._4_4_ = (uint)bVar3 * auVar143._4_4_ | (uint)!bVar3 * iStack_203c;
    local_3c40._0_4_ = (uint)bVar2 * auVar143._0_4_ | (uint)!bVar2 * local_2040;
    local_3c40._8_4_ = (uint)bVar4 * auVar143._8_4_ | (uint)!bVar4 * iStack_2038;
    local_3c40._12_4_ = (uint)bVar5 * auVar143._12_4_ | (uint)!bVar5 * iStack_2034;
    uStack_3c30._0_4_ = (uint)bVar6 * auVar143._16_4_ | (uint)!bVar6 * iStack_2030;
    uStack_3c30._4_4_ = (uint)bVar7 * auVar143._20_4_ | (uint)!bVar7 * iStack_202c;
    uStack_3c28._0_4_ = (uint)bVar8 * auVar143._24_4_ | (uint)!bVar8 * iStack_2028;
    uStack_3c28._4_4_ = (uint)bVar9 * auVar143._28_4_ | (uint)!bVar9 * iStack_2024;
    auVar147 = _local_3c40;
    uStack_3c20._0_4_ =
         (uint)(bVar10 & 1) * auVar143._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_2020;
    uStack_3c20._4_4_ = (uint)bVar11 * auVar143._36_4_ | (uint)!bVar11 * iStack_201c;
    auVar137 = _local_3c40;
    uStack_3c18._0_4_ = (uint)bVar12 * auVar143._40_4_ | (uint)!bVar12 * iStack_2018;
    uStack_3c18._4_4_ = (uint)bVar13 * auVar143._44_4_ | (uint)!bVar13 * iStack_2014;
    auVar138 = _local_3c40;
    uStack_3c10._0_4_ = (uint)bVar14 * auVar143._48_4_ | (uint)!bVar14 * iStack_2010;
    uStack_3c10._4_4_ = (uint)bVar15 * auVar143._52_4_ | (uint)!bVar15 * iStack_200c;
    auVar139 = _local_3c40;
    uStack_3c08._0_4_ = (uint)bVar16 * auVar143._56_4_ | (uint)!bVar16 * iStack_2008;
    uStack_3c08._4_4_ =
         (uint)(bVar10 >> 7) * auVar143._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_2004;
    auVar143 = _local_3c40;
    uStack_3c28 = auVar147._24_8_;
    uStack_3c20 = auVar137._32_8_;
    uStack_3c18 = auVar138._40_8_;
    uStack_3c10 = auVar139._48_8_;
    uStack_3c08 = auVar143._56_8_;
    auVar32._16_8_ = uStack_3c30;
    auVar32._0_16_ = local_3c40;
    auVar32._24_8_ = uStack_3c28;
    auVar32._32_8_ = uStack_3c20;
    auVar32._40_8_ = uStack_3c18;
    auVar32._48_8_ = uStack_3c10;
    auVar32._56_8_ = uStack_3c08;
    auVar31._16_8_ = uStack_3c30;
    auVar31._0_16_ = local_3c40;
    auVar31._24_8_ = uStack_3c28;
    auVar31._32_8_ = uStack_3c20;
    auVar31._40_8_ = uStack_3c18;
    auVar31._48_8_ = uStack_3c10;
    auVar31._56_8_ = uStack_3c08;
    auVar143 = vmulps_avx512f(auVar32,auVar31);
    local_3e40._8_4_ = 0.070376836;
    local_3e40._12_4_ = 0.070376836;
    local_3e40._0_4_ = 0.070376836;
    local_3e40._4_4_ = 0.070376836;
    auVar54._16_4_ = 0.070376836;
    auVar54._20_4_ = 0.070376836;
    auVar54._0_16_ = local_3e40._0_16_;
    auVar54._24_4_ = 0.070376836;
    auVar54._28_4_ = 0.070376836;
    auVar54._32_4_ = 0.070376836;
    auVar54._36_4_ = 0.070376836;
    auVar54._40_4_ = 0.070376836;
    auVar54._44_4_ = 0.070376836;
    auVar54._48_4_ = 0.070376836;
    auVar54._52_4_ = 0.070376836;
    auVar54._56_4_ = 0.070376836;
    auVar54._60_4_ = 0.070376836;
    auVar53._16_8_ = uStack_3c30;
    auVar53._0_16_ = local_3c40;
    auVar53._24_8_ = uStack_3c28;
    auVar53._32_8_ = uStack_3c20;
    auVar53._40_8_ = uStack_3c18;
    auVar53._48_8_ = uStack_3c10;
    auVar53._56_8_ = uStack_3c08;
    auVar52._8_4_ = -0.1151461;
    auVar52._12_4_ = -0.1151461;
    auVar52._0_4_ = -0.1151461;
    auVar52._4_4_ = -0.1151461;
    auVar52._16_4_ = -0.1151461;
    auVar52._20_4_ = -0.1151461;
    auVar52._24_4_ = -0.1151461;
    auVar52._28_4_ = -0.1151461;
    auVar52._32_4_ = -0.1151461;
    auVar52._36_4_ = -0.1151461;
    auVar52._40_4_ = -0.1151461;
    auVar52._44_4_ = -0.1151461;
    auVar52._48_4_ = -0.1151461;
    auVar52._52_4_ = -0.1151461;
    auVar52._56_4_ = -0.1151461;
    auVar52._60_4_ = -0.1151461;
    auVar145 = vfmadd213ps_avx512f(auVar53,auVar54,auVar52);
    auVar51._16_8_ = uStack_3c30;
    auVar51._0_16_ = local_3c40;
    auVar51._24_8_ = uStack_3c28;
    auVar51._32_8_ = uStack_3c20;
    auVar51._40_8_ = uStack_3c18;
    auVar51._48_8_ = uStack_3c10;
    auVar51._56_8_ = uStack_3c08;
    auVar50._8_4_ = 0.116769984;
    auVar50._12_4_ = 0.116769984;
    auVar50._0_4_ = 0.116769984;
    auVar50._4_4_ = 0.116769984;
    auVar50._16_4_ = 0.116769984;
    auVar50._20_4_ = 0.116769984;
    auVar50._24_4_ = 0.116769984;
    auVar50._28_4_ = 0.116769984;
    auVar50._32_4_ = 0.116769984;
    auVar50._36_4_ = 0.116769984;
    auVar50._40_4_ = 0.116769984;
    auVar50._44_4_ = 0.116769984;
    auVar50._48_4_ = 0.116769984;
    auVar50._52_4_ = 0.116769984;
    auVar50._56_4_ = 0.116769984;
    auVar50._60_4_ = 0.116769984;
    auVar145 = vfmadd213ps_avx512f(auVar51,auVar145,auVar50);
    auVar49._16_8_ = uStack_3c30;
    auVar49._0_16_ = local_3c40;
    auVar49._24_8_ = uStack_3c28;
    auVar49._32_8_ = uStack_3c20;
    auVar49._40_8_ = uStack_3c18;
    auVar49._48_8_ = uStack_3c10;
    auVar49._56_8_ = uStack_3c08;
    auVar48._8_4_ = -0.12420141;
    auVar48._12_4_ = -0.12420141;
    auVar48._0_4_ = -0.12420141;
    auVar48._4_4_ = -0.12420141;
    auVar48._16_4_ = -0.12420141;
    auVar48._20_4_ = -0.12420141;
    auVar48._24_4_ = -0.12420141;
    auVar48._28_4_ = -0.12420141;
    auVar48._32_4_ = -0.12420141;
    auVar48._36_4_ = -0.12420141;
    auVar48._40_4_ = -0.12420141;
    auVar48._44_4_ = -0.12420141;
    auVar48._48_4_ = -0.12420141;
    auVar48._52_4_ = -0.12420141;
    auVar48._56_4_ = -0.12420141;
    auVar48._60_4_ = -0.12420141;
    auVar145 = vfmadd213ps_avx512f(auVar49,auVar145,auVar48);
    auVar47._16_8_ = uStack_3c30;
    auVar47._0_16_ = local_3c40;
    auVar47._24_8_ = uStack_3c28;
    auVar47._32_8_ = uStack_3c20;
    auVar47._40_8_ = uStack_3c18;
    auVar47._48_8_ = uStack_3c10;
    auVar47._56_8_ = uStack_3c08;
    auVar46._8_4_ = 0.14249323;
    auVar46._12_4_ = 0.14249323;
    auVar46._0_4_ = 0.14249323;
    auVar46._4_4_ = 0.14249323;
    auVar46._16_4_ = 0.14249323;
    auVar46._20_4_ = 0.14249323;
    auVar46._24_4_ = 0.14249323;
    auVar46._28_4_ = 0.14249323;
    auVar46._32_4_ = 0.14249323;
    auVar46._36_4_ = 0.14249323;
    auVar46._40_4_ = 0.14249323;
    auVar46._44_4_ = 0.14249323;
    auVar46._48_4_ = 0.14249323;
    auVar46._52_4_ = 0.14249323;
    auVar46._56_4_ = 0.14249323;
    auVar46._60_4_ = 0.14249323;
    auVar145 = vfmadd213ps_avx512f(auVar47,auVar145,auVar46);
    auVar45._16_8_ = uStack_3c30;
    auVar45._0_16_ = local_3c40;
    auVar45._24_8_ = uStack_3c28;
    auVar45._32_8_ = uStack_3c20;
    auVar45._40_8_ = uStack_3c18;
    auVar45._48_8_ = uStack_3c10;
    auVar45._56_8_ = uStack_3c08;
    auVar44._8_4_ = -0.16668057;
    auVar44._12_4_ = -0.16668057;
    auVar44._0_4_ = -0.16668057;
    auVar44._4_4_ = -0.16668057;
    auVar44._16_4_ = -0.16668057;
    auVar44._20_4_ = -0.16668057;
    auVar44._24_4_ = -0.16668057;
    auVar44._28_4_ = -0.16668057;
    auVar44._32_4_ = -0.16668057;
    auVar44._36_4_ = -0.16668057;
    auVar44._40_4_ = -0.16668057;
    auVar44._44_4_ = -0.16668057;
    auVar44._48_4_ = -0.16668057;
    auVar44._52_4_ = -0.16668057;
    auVar44._56_4_ = -0.16668057;
    auVar44._60_4_ = -0.16668057;
    auVar145 = vfmadd213ps_avx512f(auVar45,auVar145,auVar44);
    auVar43._16_8_ = uStack_3c30;
    auVar43._0_16_ = local_3c40;
    auVar43._24_8_ = uStack_3c28;
    auVar43._32_8_ = uStack_3c20;
    auVar43._40_8_ = uStack_3c18;
    auVar43._48_8_ = uStack_3c10;
    auVar43._56_8_ = uStack_3c08;
    auVar42._8_4_ = 0.20000714;
    auVar42._12_4_ = 0.20000714;
    auVar42._0_4_ = 0.20000714;
    auVar42._4_4_ = 0.20000714;
    auVar42._16_4_ = 0.20000714;
    auVar42._20_4_ = 0.20000714;
    auVar42._24_4_ = 0.20000714;
    auVar42._28_4_ = 0.20000714;
    auVar42._32_4_ = 0.20000714;
    auVar42._36_4_ = 0.20000714;
    auVar42._40_4_ = 0.20000714;
    auVar42._44_4_ = 0.20000714;
    auVar42._48_4_ = 0.20000714;
    auVar42._52_4_ = 0.20000714;
    auVar42._56_4_ = 0.20000714;
    auVar42._60_4_ = 0.20000714;
    auVar145 = vfmadd213ps_avx512f(auVar43,auVar145,auVar42);
    auVar41._16_8_ = uStack_3c30;
    auVar41._0_16_ = local_3c40;
    auVar41._24_8_ = uStack_3c28;
    auVar41._32_8_ = uStack_3c20;
    auVar41._40_8_ = uStack_3c18;
    auVar41._48_8_ = uStack_3c10;
    auVar41._56_8_ = uStack_3c08;
    auVar40._8_4_ = -0.24999994;
    auVar40._12_4_ = -0.24999994;
    auVar40._0_4_ = -0.24999994;
    auVar40._4_4_ = -0.24999994;
    auVar40._16_4_ = -0.24999994;
    auVar40._20_4_ = -0.24999994;
    auVar40._24_4_ = -0.24999994;
    auVar40._28_4_ = -0.24999994;
    auVar40._32_4_ = -0.24999994;
    auVar40._36_4_ = -0.24999994;
    auVar40._40_4_ = -0.24999994;
    auVar40._44_4_ = -0.24999994;
    auVar40._48_4_ = -0.24999994;
    auVar40._52_4_ = -0.24999994;
    auVar40._56_4_ = -0.24999994;
    auVar40._60_4_ = -0.24999994;
    auVar145 = vfmadd213ps_avx512f(auVar41,auVar145,auVar40);
    auVar39._16_8_ = uStack_3c30;
    auVar39._0_16_ = local_3c40;
    auVar39._24_8_ = uStack_3c28;
    auVar39._32_8_ = uStack_3c20;
    auVar39._40_8_ = uStack_3c18;
    auVar39._48_8_ = uStack_3c10;
    auVar39._56_8_ = uStack_3c08;
    auVar38._8_4_ = 0.3333333;
    auVar38._12_4_ = 0.3333333;
    auVar38._0_4_ = 0.3333333;
    auVar38._4_4_ = 0.3333333;
    auVar38._16_4_ = 0.3333333;
    auVar38._20_4_ = 0.3333333;
    auVar38._24_4_ = 0.3333333;
    auVar38._28_4_ = 0.3333333;
    auVar38._32_4_ = 0.3333333;
    auVar38._36_4_ = 0.3333333;
    auVar38._40_4_ = 0.3333333;
    auVar38._44_4_ = 0.3333333;
    auVar38._48_4_ = 0.3333333;
    auVar38._52_4_ = 0.3333333;
    auVar38._56_4_ = 0.3333333;
    auVar38._60_4_ = 0.3333333;
    auVar145 = vfmadd213ps_avx512f(auVar39,auVar145,auVar38);
    auVar30._16_8_ = uStack_3c30;
    auVar30._0_16_ = local_3c40;
    auVar30._24_8_ = uStack_3c28;
    auVar30._32_8_ = uStack_3c20;
    auVar30._40_8_ = uStack_3c18;
    auVar30._48_8_ = uStack_3c10;
    auVar30._56_8_ = uStack_3c08;
    auVar145 = vmulps_avx512f(auVar145,auVar30);
    auVar145 = vmulps_avx512f(auVar145,auVar143);
    uStack_3d28 = auVar17._24_8_;
    uStack_3d20 = auVar134._32_8_;
    uStack_3d18 = auVar135._40_8_;
    uStack_3d10 = auVar136._48_8_;
    uStack_3d08 = auVar144._56_8_;
    auVar37._16_8_ = uStack_3d30;
    auVar37._0_16_ = local_3d40;
    auVar37._24_8_ = uStack_3d28;
    auVar37._32_8_ = uStack_3d20;
    auVar37._40_8_ = uStack_3d18;
    auVar37._48_8_ = uStack_3d10;
    auVar37._56_8_ = uStack_3d08;
    auVar36._8_4_ = -0.00021219444;
    auVar36._12_4_ = -0.00021219444;
    auVar36._0_4_ = -0.00021219444;
    auVar36._4_4_ = -0.00021219444;
    auVar36._16_4_ = -0.00021219444;
    auVar36._20_4_ = -0.00021219444;
    auVar36._24_4_ = -0.00021219444;
    auVar36._28_4_ = -0.00021219444;
    auVar36._32_4_ = -0.00021219444;
    auVar36._36_4_ = -0.00021219444;
    auVar36._40_4_ = -0.00021219444;
    auVar36._44_4_ = -0.00021219444;
    auVar36._48_4_ = -0.00021219444;
    auVar36._52_4_ = -0.00021219444;
    auVar36._56_4_ = -0.00021219444;
    auVar36._60_4_ = -0.00021219444;
    auVar144 = vfmadd213ps_avx512f(auVar36,auVar37,auVar145);
    auVar65._8_4_ = 0.5;
    auVar65._12_4_ = 0.5;
    auVar65._0_4_ = 0.5;
    auVar65._4_4_ = 0.5;
    auVar65._16_4_ = 0.5;
    auVar65._20_4_ = 0.5;
    auVar65._24_4_ = 0.5;
    auVar65._28_4_ = 0.5;
    auVar65._32_4_ = 0.5;
    auVar65._36_4_ = 0.5;
    auVar65._40_4_ = 0.5;
    auVar65._44_4_ = 0.5;
    auVar65._48_4_ = 0.5;
    auVar65._52_4_ = 0.5;
    auVar65._56_4_ = 0.5;
    auVar65._60_4_ = 0.5;
    auVar144 = vfnmadd213ps_avx512f(auVar65,auVar143,auVar144);
    auVar27._16_8_ = uStack_3c30;
    auVar27._0_16_ = local_3c40;
    auVar27._24_8_ = uStack_3c28;
    auVar27._32_8_ = uStack_3c20;
    auVar27._40_8_ = uStack_3c18;
    auVar27._48_8_ = uStack_3c10;
    auVar27._56_8_ = uStack_3c08;
    auVar144 = vaddps_avx512f(auVar27,auVar144);
    auVar35._16_8_ = uStack_3d30;
    auVar35._0_16_ = local_3d40;
    auVar35._24_8_ = uStack_3d28;
    auVar35._32_8_ = uStack_3d20;
    auVar35._40_8_ = uStack_3d18;
    auVar35._48_8_ = uStack_3d10;
    auVar35._56_8_ = uStack_3d08;
    auVar34._8_4_ = 0.6933594;
    auVar34._12_4_ = 0.6933594;
    auVar34._0_4_ = 0.6933594;
    auVar34._4_4_ = 0.6933594;
    auVar34._16_4_ = 0.6933594;
    auVar34._20_4_ = 0.6933594;
    auVar34._24_4_ = 0.6933594;
    auVar34._28_4_ = 0.6933594;
    auVar34._32_4_ = 0.6933594;
    auVar34._36_4_ = 0.6933594;
    auVar34._40_4_ = 0.6933594;
    auVar34._44_4_ = 0.6933594;
    auVar34._48_4_ = 0.6933594;
    auVar34._52_4_ = 0.6933594;
    auVar34._56_4_ = 0.6933594;
    auVar34._60_4_ = 0.6933594;
    auVar143 = vfmadd213ps_avx512f(auVar34,auVar35,auVar144);
    auVar144 = vpmovm2d_avx512dq(uVar23 & 0xffff);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar143 = vmovdqa64_avx512f(auVar143);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vpord_avx512f(auVar143,auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmulps_avx512f(auVar142,auVar144);
    auVar145._8_4_ = 88.37626;
    auVar145._12_4_ = 88.37626;
    auVar145._0_4_ = 88.37626;
    auVar145._4_4_ = 88.37626;
    auVar145._16_4_ = 88.37626;
    auVar145._20_4_ = 88.37626;
    auVar145._24_4_ = 88.37626;
    auVar145._28_4_ = 88.37626;
    auVar145._32_4_ = 88.37626;
    auVar145._36_4_ = 88.37626;
    auVar145._40_4_ = 88.37626;
    auVar145._44_4_ = 88.37626;
    auVar145._48_4_ = 88.37626;
    auVar145._52_4_ = 88.37626;
    auVar145._56_4_ = 88.37626;
    auVar145._60_4_ = 88.37626;
    auVar144 = vminps_avx512f(auVar144,auVar145);
    auVar143._8_4_ = -88.37626;
    auVar143._12_4_ = -88.37626;
    auVar143._0_4_ = -88.37626;
    auVar143._4_4_ = -88.37626;
    auVar143._16_4_ = -88.37626;
    auVar143._20_4_ = -88.37626;
    auVar143._24_4_ = -88.37626;
    auVar143._28_4_ = -88.37626;
    auVar143._32_4_ = -88.37626;
    auVar143._36_4_ = -88.37626;
    auVar143._40_4_ = -88.37626;
    auVar143._44_4_ = -88.37626;
    auVar143._48_4_ = -88.37626;
    auVar143._52_4_ = -88.37626;
    auVar143._56_4_ = -88.37626;
    auVar143._60_4_ = -88.37626;
    auVar143 = vmaxps_avx512f(auVar144,auVar143);
    auVar62._8_4_ = 1.442695;
    auVar62._12_4_ = 1.442695;
    auVar62._0_4_ = 1.442695;
    auVar62._4_4_ = 1.442695;
    auVar62._16_4_ = 1.442695;
    auVar62._20_4_ = 1.442695;
    auVar62._24_4_ = 1.442695;
    auVar62._28_4_ = 1.442695;
    auVar62._32_4_ = 1.442695;
    auVar62._36_4_ = 1.442695;
    auVar62._40_4_ = 1.442695;
    auVar62._44_4_ = 1.442695;
    auVar62._48_4_ = 1.442695;
    auVar62._52_4_ = 1.442695;
    auVar62._56_4_ = 1.442695;
    auVar62._60_4_ = 1.442695;
    auVar61._8_4_ = 0.5;
    auVar61._12_4_ = 0.5;
    auVar61._0_4_ = 0.5;
    auVar61._4_4_ = 0.5;
    auVar61._16_4_ = 0.5;
    auVar61._20_4_ = 0.5;
    auVar61._24_4_ = 0.5;
    auVar61._28_4_ = 0.5;
    auVar61._32_4_ = 0.5;
    auVar61._36_4_ = 0.5;
    auVar61._40_4_ = 0.5;
    auVar61._44_4_ = 0.5;
    auVar61._48_4_ = 0.5;
    auVar61._52_4_ = 0.5;
    auVar61._56_4_ = 0.5;
    auVar61._60_4_ = 0.5;
    auVar144 = vfmadd213ps_avx512f(auVar62,auVar143,auVar61);
    auVar145 = vrndscaleps_avx512f(auVar144,1);
    uVar24 = vcmpps_avx512f(auVar144,auVar145,1);
    uVar26 = (ushort)uVar24;
    auVar64._8_4_ = 1.0;
    auVar64._12_4_ = 1.0;
    auVar64._0_4_ = 1.0;
    auVar64._4_4_ = 1.0;
    auVar64._16_4_ = 1.0;
    auVar64._20_4_ = 1.0;
    auVar64._24_4_ = 1.0;
    auVar64._28_4_ = 1.0;
    auVar64._32_4_ = 1.0;
    auVar64._36_4_ = 1.0;
    auVar64._40_4_ = 1.0;
    auVar64._44_4_ = 1.0;
    auVar64._48_4_ = 1.0;
    auVar64._52_4_ = 1.0;
    auVar64._56_4_ = 1.0;
    auVar64._60_4_ = 1.0;
    local_2900 = auVar145._0_4_;
    iStack_28fc = auVar145._4_4_;
    iStack_28f8 = auVar145._8_4_;
    iStack_28f4 = auVar145._12_4_;
    iStack_28f0 = auVar145._16_4_;
    iStack_28ec = auVar145._20_4_;
    iStack_28e8 = auVar145._24_4_;
    iStack_28e4 = auVar145._28_4_;
    iStack_28e0 = auVar145._32_4_;
    iStack_28dc = auVar145._36_4_;
    iStack_28d8 = auVar145._40_4_;
    iStack_28d4 = auVar145._44_4_;
    iStack_28d0 = auVar145._48_4_;
    iStack_28cc = auVar145._52_4_;
    iStack_28c8 = auVar145._56_4_;
    iStack_28c4 = auVar145._60_4_;
    auVar144 = vsubps_avx512f(auVar145,auVar64);
    bVar2 = (bool)((byte)uVar24 & 1);
    bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
    bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
    bVar10 = (byte)((ulong)uVar24 >> 8);
    bVar11 = (bool)(bVar10 >> 1 & 1);
    bVar12 = (bool)(bVar10 >> 2 & 1);
    bVar13 = (bool)(bVar10 >> 3 & 1);
    bVar14 = (bool)(bVar10 >> 4 & 1);
    bVar15 = (bool)(bVar10 >> 5 & 1);
    bVar16 = (bool)(bVar10 >> 6 & 1);
    local_4180._4_4_ = (uint)bVar3 * auVar144._4_4_ | (uint)!bVar3 * iStack_28fc;
    local_4180._0_4_ = (uint)bVar2 * auVar144._0_4_ | (uint)!bVar2 * local_2900;
    local_4180._8_4_ = (uint)bVar4 * auVar144._8_4_ | (uint)!bVar4 * iStack_28f8;
    local_4180._12_4_ = (uint)bVar5 * auVar144._12_4_ | (uint)!bVar5 * iStack_28f4;
    uStack_4170._0_4_ = (uint)bVar6 * auVar144._16_4_ | (uint)!bVar6 * iStack_28f0;
    uStack_4170._4_4_ = (uint)bVar7 * auVar144._20_4_ | (uint)!bVar7 * iStack_28ec;
    uStack_4168._0_4_ = (uint)bVar8 * auVar144._24_4_ | (uint)!bVar8 * iStack_28e8;
    uStack_4168._4_4_ = (uint)bVar9 * auVar144._28_4_ | (uint)!bVar9 * iStack_28e4;
    auVar17 = _local_4180;
    uStack_4160._0_4_ =
         (uint)(bVar10 & 1) * auVar144._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_28e0;
    uStack_4160._4_4_ = (uint)bVar11 * auVar144._36_4_ | (uint)!bVar11 * iStack_28dc;
    auVar134 = _local_4180;
    uStack_4158._0_4_ = (uint)bVar12 * auVar144._40_4_ | (uint)!bVar12 * iStack_28d8;
    uStack_4158._4_4_ = (uint)bVar13 * auVar144._44_4_ | (uint)!bVar13 * iStack_28d4;
    auVar135 = _local_4180;
    uStack_4150._0_4_ = (uint)bVar14 * auVar144._48_4_ | (uint)!bVar14 * iStack_28d0;
    uStack_4150._4_4_ = (uint)bVar15 * auVar144._52_4_ | (uint)!bVar15 * iStack_28cc;
    auVar136 = _local_4180;
    uStack_4148._0_4_ = (uint)bVar16 * auVar144._56_4_ | (uint)!bVar16 * iStack_28c8;
    uStack_4148._4_4_ =
         (uint)(bVar10 >> 7) * auVar144._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_28c4;
    auVar144 = _local_4180;
    uStack_4168 = auVar17._24_8_;
    uStack_4160 = auVar134._32_8_;
    uStack_4158 = auVar135._40_8_;
    uStack_4150 = auVar136._48_8_;
    uStack_4148 = auVar144._56_8_;
    auVar69._16_8_ = uStack_4170;
    auVar69._0_16_ = local_4180;
    auVar69._24_8_ = uStack_4168;
    auVar69._32_8_ = uStack_4160;
    auVar69._40_8_ = uStack_4158;
    auVar69._48_8_ = uStack_4150;
    auVar69._56_8_ = uStack_4148;
    auVar68._8_4_ = 0.6933594;
    auVar68._12_4_ = 0.6933594;
    auVar68._0_4_ = 0.6933594;
    auVar68._4_4_ = 0.6933594;
    auVar68._16_4_ = 0.6933594;
    auVar68._20_4_ = 0.6933594;
    auVar68._24_4_ = 0.6933594;
    auVar68._28_4_ = 0.6933594;
    auVar68._32_4_ = 0.6933594;
    auVar68._36_4_ = 0.6933594;
    auVar68._40_4_ = 0.6933594;
    auVar68._44_4_ = 0.6933594;
    auVar68._48_4_ = 0.6933594;
    auVar68._52_4_ = 0.6933594;
    auVar68._56_4_ = 0.6933594;
    auVar68._60_4_ = 0.6933594;
    auVar144 = vfnmadd213ps_avx512f(auVar68,auVar69,auVar143);
    auVar67._16_8_ = uStack_4170;
    auVar67._0_16_ = local_4180;
    auVar67._24_8_ = uStack_4168;
    auVar67._32_8_ = uStack_4160;
    auVar67._40_8_ = uStack_4158;
    auVar67._48_8_ = uStack_4150;
    auVar67._56_8_ = uStack_4148;
    auVar66._8_4_ = -0.00021219444;
    auVar66._12_4_ = -0.00021219444;
    auVar66._0_4_ = -0.00021219444;
    auVar66._4_4_ = -0.00021219444;
    auVar66._16_4_ = -0.00021219444;
    auVar66._20_4_ = -0.00021219444;
    auVar66._24_4_ = -0.00021219444;
    auVar66._28_4_ = -0.00021219444;
    auVar66._32_4_ = -0.00021219444;
    auVar66._36_4_ = -0.00021219444;
    auVar66._40_4_ = -0.00021219444;
    auVar66._44_4_ = -0.00021219444;
    auVar66._48_4_ = -0.00021219444;
    auVar66._52_4_ = -0.00021219444;
    auVar66._56_4_ = -0.00021219444;
    auVar66._60_4_ = -0.00021219444;
    auVar144 = vfnmadd213ps_avx512f(auVar66,auVar67,auVar144);
    auVar143 = vmulps_avx512f(auVar144,auVar144);
    uStack_4278._0_4_ = 0.00019875691;
    uStack_4278._4_4_ = 0.00019875691;
    local_4280._0_4_ = 0.00019875691;
    local_4280._4_4_ = 0.00019875691;
    auVar60._16_4_ = 0.00019875691;
    auVar60._20_4_ = 0.00019875691;
    auVar60._0_16_ = _local_4280;
    auVar60._24_4_ = 0.00019875691;
    auVar60._28_4_ = 0.00019875691;
    auVar60._32_4_ = 0.00019875691;
    auVar60._36_4_ = 0.00019875691;
    auVar60._40_4_ = 0.00019875691;
    auVar60._44_4_ = 0.00019875691;
    auVar60._48_4_ = 0.00019875691;
    auVar60._52_4_ = 0.00019875691;
    auVar60._56_4_ = 0.00019875691;
    auVar60._60_4_ = 0.00019875691;
    auVar59._8_4_ = 0.0013981999;
    auVar59._12_4_ = 0.0013981999;
    auVar59._0_4_ = 0.0013981999;
    auVar59._4_4_ = 0.0013981999;
    auVar59._16_4_ = 0.0013981999;
    auVar59._20_4_ = 0.0013981999;
    auVar59._24_4_ = 0.0013981999;
    auVar59._28_4_ = 0.0013981999;
    auVar59._32_4_ = 0.0013981999;
    auVar59._36_4_ = 0.0013981999;
    auVar59._40_4_ = 0.0013981999;
    auVar59._44_4_ = 0.0013981999;
    auVar59._48_4_ = 0.0013981999;
    auVar59._52_4_ = 0.0013981999;
    auVar59._56_4_ = 0.0013981999;
    auVar59._60_4_ = 0.0013981999;
    auVar145 = vfmadd213ps_avx512f(auVar144,auVar60,auVar59);
    auVar58._8_4_ = 0.008333452;
    auVar58._12_4_ = 0.008333452;
    auVar58._0_4_ = 0.008333452;
    auVar58._4_4_ = 0.008333452;
    auVar58._16_4_ = 0.008333452;
    auVar58._20_4_ = 0.008333452;
    auVar58._24_4_ = 0.008333452;
    auVar58._28_4_ = 0.008333452;
    auVar58._32_4_ = 0.008333452;
    auVar58._36_4_ = 0.008333452;
    auVar58._40_4_ = 0.008333452;
    auVar58._44_4_ = 0.008333452;
    auVar58._48_4_ = 0.008333452;
    auVar58._52_4_ = 0.008333452;
    auVar58._56_4_ = 0.008333452;
    auVar58._60_4_ = 0.008333452;
    auVar145 = vfmadd213ps_avx512f(auVar144,auVar145,auVar58);
    auVar57._8_4_ = 0.041665796;
    auVar57._12_4_ = 0.041665796;
    auVar57._0_4_ = 0.041665796;
    auVar57._4_4_ = 0.041665796;
    auVar57._16_4_ = 0.041665796;
    auVar57._20_4_ = 0.041665796;
    auVar57._24_4_ = 0.041665796;
    auVar57._28_4_ = 0.041665796;
    auVar57._32_4_ = 0.041665796;
    auVar57._36_4_ = 0.041665796;
    auVar57._40_4_ = 0.041665796;
    auVar57._44_4_ = 0.041665796;
    auVar57._48_4_ = 0.041665796;
    auVar57._52_4_ = 0.041665796;
    auVar57._56_4_ = 0.041665796;
    auVar57._60_4_ = 0.041665796;
    auVar145 = vfmadd213ps_avx512f(auVar144,auVar145,auVar57);
    auVar56._8_4_ = 0.16666666;
    auVar56._12_4_ = 0.16666666;
    auVar56._0_4_ = 0.16666666;
    auVar56._4_4_ = 0.16666666;
    auVar56._16_4_ = 0.16666666;
    auVar56._20_4_ = 0.16666666;
    auVar56._24_4_ = 0.16666666;
    auVar56._28_4_ = 0.16666666;
    auVar56._32_4_ = 0.16666666;
    auVar56._36_4_ = 0.16666666;
    auVar56._40_4_ = 0.16666666;
    auVar56._44_4_ = 0.16666666;
    auVar56._48_4_ = 0.16666666;
    auVar56._52_4_ = 0.16666666;
    auVar56._56_4_ = 0.16666666;
    auVar56._60_4_ = 0.16666666;
    auVar145 = vfmadd213ps_avx512f(auVar144,auVar145,auVar56);
    auVar55._8_4_ = 0.5;
    auVar55._12_4_ = 0.5;
    auVar55._0_4_ = 0.5;
    auVar55._4_4_ = 0.5;
    auVar55._16_4_ = 0.5;
    auVar55._20_4_ = 0.5;
    auVar55._24_4_ = 0.5;
    auVar55._28_4_ = 0.5;
    auVar55._32_4_ = 0.5;
    auVar55._36_4_ = 0.5;
    auVar55._40_4_ = 0.5;
    auVar55._44_4_ = 0.5;
    auVar55._48_4_ = 0.5;
    auVar55._52_4_ = 0.5;
    auVar55._56_4_ = 0.5;
    auVar55._60_4_ = 0.5;
    auVar145 = vfmadd213ps_avx512f(auVar144,auVar145,auVar55);
    auVar143 = vfmadd213ps_avx512f(auVar143,auVar145,auVar144);
    auVar144._8_4_ = 1.0;
    auVar144._12_4_ = 1.0;
    auVar144._0_4_ = 1.0;
    auVar144._4_4_ = 1.0;
    auVar144._16_4_ = 1.0;
    auVar144._20_4_ = 1.0;
    auVar144._24_4_ = 1.0;
    auVar144._28_4_ = 1.0;
    auVar144._32_4_ = 1.0;
    auVar144._36_4_ = 1.0;
    auVar144._40_4_ = 1.0;
    auVar144._44_4_ = 1.0;
    auVar144._48_4_ = 1.0;
    auVar144._52_4_ = 1.0;
    auVar144._56_4_ = 1.0;
    auVar144._60_4_ = 1.0;
    auVar145 = vaddps_avx512f(auVar143,auVar144);
    auVar70._16_8_ = uStack_4170;
    auVar70._0_16_ = local_4180;
    auVar70._24_8_ = uStack_4168;
    auVar70._32_8_ = uStack_4160;
    auVar70._40_8_ = uStack_4158;
    auVar70._48_8_ = uStack_4150;
    auVar70._56_8_ = uStack_4148;
    auVar144 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    vmovdqa64_avx512f(auVar144);
    auVar144 = vcvttps2dq_avx512f(auVar70);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar143 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar143 = vmovdqa64_avx512f(auVar143);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar143 = vmovdqa64_avx512f(auVar143);
    auVar144 = vpaddd_avx512f(auVar144,auVar143);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vpslld_avx512f(auVar144,ZEXT416(0x17));
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmovdqa64_avx512f(auVar144);
    auVar144 = vmulps_avx512f(auVar145,auVar144);
    local_4280 = auVar144._0_8_;
    uStack_4278 = auVar144._8_8_;
    uStack_4270 = auVar144._16_8_;
    uStack_4268 = auVar144._24_8_;
    uStack_4260 = auVar144._32_8_;
    uStack_4258 = auVar144._40_8_;
    uStack_4250 = auVar144._48_8_;
    uStack_4248 = auVar144._56_8_;
    *local_45e0 = local_4280;
    local_45e0[1] = uStack_4278;
    local_45e0[2] = uStack_4270;
    local_45e0[3] = uStack_4268;
    local_45e0[4] = uStack_4260;
    local_45e0[5] = uStack_4258;
    local_45e0[6] = uStack_4250;
    local_45e0[7] = uStack_4248;
    local_45d0 = local_45d0 + 1;
    local_45e0 = local_45e0 + 8;
  }
  fVar1 = *in_RSI;
  auVar18 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar1),0x20);
  auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar1),0x30);
  auVar19 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar1),0x20);
  auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar1),0x30);
  for (; local_45f4 + 7 < iVar141; local_45f4 = local_45f4 + 8) {
    auVar17 = vcmpps_avx(*(undefined1 (*) [32])*local_45d0,ZEXT1632(ZEXT816(0)),2);
    auVar22._8_4_ = 0x800000;
    auVar22._0_8_ = 0x80000000800000;
    auVar22._12_4_ = 0x800000;
    auVar22._16_4_ = 0x800000;
    auVar22._20_4_ = 0x800000;
    auVar22._24_4_ = 0x800000;
    auVar22._28_4_ = 0x800000;
    auVar147 = vmaxps_avx(*(undefined1 (*) [32])*local_45d0,auVar22);
    auVar22 = vpsrld_avx2(auVar147,ZEXT416(0x17));
    auVar76._8_4_ = 0x807fffff;
    auVar76._0_8_ = 0x807fffff807fffff;
    auVar76._12_4_ = 0x807fffff;
    auVar76._16_4_ = 0x807fffff;
    auVar76._20_4_ = 0x807fffff;
    auVar76._24_4_ = 0x807fffff;
    auVar76._28_4_ = 0x807fffff;
    auVar147 = vpand_avx2(auVar147,auVar76);
    auVar100._8_4_ = 0x3f000000;
    auVar100._0_8_ = 0x3f0000003f000000;
    auVar100._12_4_ = 0x3f000000;
    auVar100._16_4_ = 0x3f000000;
    auVar100._20_4_ = 0x3f000000;
    auVar100._24_4_ = 0x3f000000;
    auVar100._28_4_ = 0x3f000000;
    auVar21 = vpor_avx2(auVar147,auVar100);
    auVar101._8_8_ = 0x7f0000007f;
    auVar101._0_8_ = 0x7f0000007f;
    auVar101._16_8_ = 0x7f0000007f;
    auVar101._24_8_ = 0x7f0000007f;
    auVar147 = vpsubd_avx2(auVar22,auVar101);
    auVar147 = vcvtdq2ps_avx(auVar147);
    local_1aa0 = auVar147._0_4_;
    fStack_1a9c = auVar147._4_4_;
    fStack_1a98 = auVar147._8_4_;
    fStack_1a94 = auVar147._12_4_;
    fStack_1a90 = auVar147._16_4_;
    fStack_1a8c = auVar147._20_4_;
    fStack_1a88 = auVar147._24_4_;
    fStack_1a84 = auVar147._28_4_;
    local_1be0._4_4_ = fStack_1a9c + 1.0;
    local_1be0._0_4_ = local_1aa0 + 1.0;
    fStack_1bd8 = fStack_1a98 + 1.0;
    fStack_1bd4 = fStack_1a94 + 1.0;
    uStack_1bd0._0_4_ = fStack_1a90 + 1.0;
    uStack_1bd0._4_4_ = fStack_1a8c + 1.0;
    uStack_1bc8._0_4_ = fStack_1a88 + 1.0;
    uStack_1bc8._4_4_ = fStack_1a84 + 1.0;
    auVar73 = _local_1be0;
    auVar151._8_4_ = 0x3f3504f3;
    auVar151._0_8_ = 0x3f3504f33f3504f3;
    auVar151._12_4_ = 0x3f3504f3;
    auVar151._16_4_ = 0x3f3504f3;
    auVar151._20_4_ = 0x3f3504f3;
    auVar151._24_4_ = 0x3f3504f3;
    auVar151._28_4_ = 0x3f3504f3;
    auVar147 = vcmpps_avx(auVar21,auVar151,1);
    auVar22 = vpand_avx2(auVar21,auVar147);
    auVar74._8_8_ = 0x3f8000003f800000;
    auVar74._0_8_ = 0x3f8000003f800000;
    auVar74._16_8_ = 0x3f8000003f800000;
    auVar74._24_8_ = 0x3f8000003f800000;
    auVar21 = vsubps_avx(auVar21,auVar74);
    uStack_1bc8 = auVar73._24_8_;
    auVar75._8_8_ = 0x3f8000003f800000;
    auVar75._0_8_ = 0x3f8000003f800000;
    auVar75._16_8_ = 0x3f8000003f800000;
    auVar75._24_8_ = 0x3f8000003f800000;
    auVar147 = vpand_avx2(auVar75,auVar147);
    auVar73._16_8_ = uStack_1bd0;
    auVar73._0_16_ = _local_1be0;
    auVar73._24_8_ = uStack_1bc8;
    auVar147 = vsubps_avx(auVar73,auVar147);
    local_1ae0 = auVar21._0_4_;
    fStack_1adc = auVar21._4_4_;
    fStack_1ad8 = auVar21._8_4_;
    fStack_1ad4 = auVar21._12_4_;
    fStack_1ad0 = auVar21._16_4_;
    fStack_1acc = auVar21._20_4_;
    fStack_1ac8 = auVar21._24_4_;
    fStack_1ac4 = auVar21._28_4_;
    local_1b00 = auVar22._0_4_;
    fStack_1afc = auVar22._4_4_;
    fStack_1af8 = auVar22._8_4_;
    fStack_1af4 = auVar22._12_4_;
    fStack_1af0 = auVar22._16_4_;
    fStack_1aec = auVar22._20_4_;
    fStack_1ae8 = auVar22._24_4_;
    fStack_1ae4 = auVar22._28_4_;
    local_1b60._0_4_ = local_1ae0 + local_1b00;
    local_1b60._4_4_ = fStack_1adc + fStack_1afc;
    fStack_1b58 = fStack_1ad8 + fStack_1af8;
    fStack_1b54 = fStack_1ad4 + fStack_1af4;
    fStack_1b50 = fStack_1ad0 + fStack_1af0;
    fStack_1b4c = fStack_1acc + fStack_1aec;
    fStack_1b48 = fStack_1ac8 + fStack_1ae8;
    fStack_1b44 = fStack_1ac4 + fStack_1ae4;
    fStack_1c58 = 0.070376836;
    local_1c60 = (undefined1  [8])0x3d9021bb3d9021bb;
    fStack_1c54 = 0.070376836;
    fStack_1c50 = 0.070376836;
    fStack_1c4c = 0.070376836;
    fStack_1c48 = 0.070376836;
    uStack_1c44 = 0x3d9021bb;
    auVar85._8_4_ = -0.1151461;
    auVar85._12_4_ = -0.1151461;
    auVar85._0_4_ = -0.1151461;
    auVar85._4_4_ = -0.1151461;
    auVar85._16_4_ = -0.1151461;
    auVar85._20_4_ = -0.1151461;
    auVar85._24_4_ = -0.1151461;
    auVar85._28_4_ = -0.1151461;
    auVar25 = vfmadd213ps_fma(_local_1b60,_local_1c60,auVar85);
    auVar86._8_4_ = 0.116769984;
    auVar86._12_4_ = 0.116769984;
    auVar86._0_4_ = 0.116769984;
    auVar86._4_4_ = 0.116769984;
    auVar86._16_4_ = 0.116769984;
    auVar86._20_4_ = 0.116769984;
    auVar86._24_4_ = 0.116769984;
    auVar86._28_4_ = 0.116769984;
    auVar25 = vfmadd213ps_fma(_local_1b60,ZEXT1632(auVar25),auVar86);
    auVar87._8_4_ = -0.12420141;
    auVar87._12_4_ = -0.12420141;
    auVar87._0_4_ = -0.12420141;
    auVar87._4_4_ = -0.12420141;
    auVar87._16_4_ = -0.12420141;
    auVar87._20_4_ = -0.12420141;
    auVar87._24_4_ = -0.12420141;
    auVar87._28_4_ = -0.12420141;
    auVar25 = vfmadd213ps_fma(_local_1b60,ZEXT1632(auVar25),auVar87);
    auVar88._8_4_ = 0.14249323;
    auVar88._12_4_ = 0.14249323;
    auVar88._0_4_ = 0.14249323;
    auVar88._4_4_ = 0.14249323;
    auVar88._16_4_ = 0.14249323;
    auVar88._20_4_ = 0.14249323;
    auVar88._24_4_ = 0.14249323;
    auVar88._28_4_ = 0.14249323;
    auVar25 = vfmadd213ps_fma(_local_1b60,ZEXT1632(auVar25),auVar88);
    auVar89._8_4_ = -0.16668057;
    auVar89._12_4_ = -0.16668057;
    auVar89._0_4_ = -0.16668057;
    auVar89._4_4_ = -0.16668057;
    auVar89._16_4_ = -0.16668057;
    auVar89._20_4_ = -0.16668057;
    auVar89._24_4_ = -0.16668057;
    auVar89._28_4_ = -0.16668057;
    auVar25 = vfmadd213ps_fma(_local_1b60,ZEXT1632(auVar25),auVar89);
    auVar90._8_4_ = 0.20000714;
    auVar90._12_4_ = 0.20000714;
    auVar90._0_4_ = 0.20000714;
    auVar90._4_4_ = 0.20000714;
    auVar90._16_4_ = 0.20000714;
    auVar90._20_4_ = 0.20000714;
    auVar90._24_4_ = 0.20000714;
    auVar90._28_4_ = 0.20000714;
    auVar25 = vfmadd213ps_fma(_local_1b60,ZEXT1632(auVar25),auVar90);
    auVar91._8_4_ = -0.24999994;
    auVar91._12_4_ = -0.24999994;
    auVar91._0_4_ = -0.24999994;
    auVar91._4_4_ = -0.24999994;
    auVar91._16_4_ = -0.24999994;
    auVar91._20_4_ = -0.24999994;
    auVar91._24_4_ = -0.24999994;
    auVar91._28_4_ = -0.24999994;
    auVar25 = vfmadd213ps_fma(_local_1b60,ZEXT1632(auVar25),auVar91);
    auVar92._8_4_ = 0.3333333;
    auVar92._12_4_ = 0.3333333;
    auVar92._0_4_ = 0.3333333;
    auVar92._4_4_ = 0.3333333;
    auVar92._16_4_ = 0.3333333;
    auVar92._20_4_ = 0.3333333;
    auVar92._24_4_ = 0.3333333;
    auVar92._28_4_ = 0.3333333;
    auVar25 = vfmadd213ps_fma(_local_1b60,ZEXT1632(auVar25),auVar92);
    local_19a0 = auVar25._0_4_;
    fStack_199c = auVar25._4_4_;
    fStack_1998 = auVar25._8_4_;
    fStack_1994 = auVar25._12_4_;
    local_1c60._4_4_ =
         fStack_199c * (float)local_1b60._4_4_ * (float)local_1b60._4_4_ * (float)local_1b60._4_4_;
    local_1c60._0_4_ =
         local_19a0 * (float)local_1b60._0_4_ * (float)local_1b60._0_4_ * (float)local_1b60._0_4_;
    fStack_1c58 = fStack_1998 * fStack_1b58 * fStack_1b58 * fStack_1b58;
    fStack_1c54 = fStack_1994 * fStack_1b54 * fStack_1b54 * fStack_1b54;
    fStack_1c50 = fStack_1b50 * 0.0 * fStack_1b50 * fStack_1b50;
    fStack_1c4c = fStack_1b4c * 0.0 * fStack_1b4c * fStack_1b4c;
    fStack_1c48 = fStack_1b48 * 0.0 * fStack_1b48 * fStack_1b48;
    uStack_1c44 = 0;
    auVar93._8_4_ = -0.00021219444;
    auVar93._12_4_ = -0.00021219444;
    auVar93._0_4_ = -0.00021219444;
    auVar93._4_4_ = -0.00021219444;
    auVar93._16_4_ = -0.00021219444;
    auVar93._20_4_ = -0.00021219444;
    auVar93._24_4_ = -0.00021219444;
    auVar93._28_4_ = -0.00021219444;
    auVar25 = vfmadd213ps_fma(auVar93,auVar147,_local_1c60);
    auVar132._4_4_ = (float)local_1b60._4_4_ * (float)local_1b60._4_4_;
    auVar132._0_4_ = (float)local_1b60._0_4_ * (float)local_1b60._0_4_;
    auVar132._8_4_ = fStack_1b58 * fStack_1b58;
    auVar132._12_4_ = fStack_1b54 * fStack_1b54;
    auVar132._16_4_ = fStack_1b50 * fStack_1b50;
    auVar132._20_4_ = fStack_1b4c * fStack_1b4c;
    auVar132._24_4_ = fStack_1b48 * fStack_1b48;
    auVar132._28_4_ = fStack_1b44;
    auVar97._8_4_ = 0.5;
    auVar97._12_4_ = 0.5;
    auVar97._0_4_ = 0.5;
    auVar97._4_4_ = 0.5;
    auVar97._16_4_ = 0.5;
    auVar97._20_4_ = 0.5;
    auVar97._24_4_ = 0.5;
    auVar97._28_4_ = 0.5;
    auVar25 = vfnmadd213ps_fma(auVar97,auVar132,ZEXT1632(auVar25));
    local_1b40 = auVar25._0_4_;
    fStack_1b3c = auVar25._4_4_;
    fStack_1b38 = auVar25._8_4_;
    fStack_1b34 = auVar25._12_4_;
    local_1b60._4_4_ = (float)local_1b60._4_4_ + fStack_1b3c;
    local_1b60._0_4_ = (float)local_1b60._0_4_ + local_1b40;
    fStack_1b58 = fStack_1b58 + fStack_1b38;
    fStack_1b54 = fStack_1b54 + fStack_1b34;
    fStack_1b50 = fStack_1b50 + 0.0;
    fStack_1b4c = fStack_1b4c + 0.0;
    fStack_1b48 = fStack_1b48 + 0.0;
    fStack_1b44 = fStack_1b44 + 0.0;
    auVar94._8_4_ = 0.6933594;
    auVar94._12_4_ = 0.6933594;
    auVar94._0_4_ = 0.6933594;
    auVar94._4_4_ = 0.6933594;
    auVar94._16_4_ = 0.6933594;
    auVar94._20_4_ = 0.6933594;
    auVar94._24_4_ = 0.6933594;
    auVar94._28_4_ = 0.6933594;
    auVar25 = vfmadd213ps_fma(auVar94,auVar147,_local_1b60);
    auVar17 = vpor_avx2(ZEXT1632(auVar25),auVar17);
    local_1f00 = auVar19._0_4_;
    fStack_1efc = auVar19._4_4_;
    fStack_1ef8 = auVar19._8_4_;
    fStack_1ef4 = auVar19._12_4_;
    fStack_1ef0 = auVar18._0_4_;
    fStack_1eec = auVar18._4_4_;
    fStack_1ee8 = auVar18._8_4_;
    uStack_1ee4 = auVar18._12_4_;
    local_1f20 = auVar17._0_4_;
    fStack_1f1c = auVar17._4_4_;
    fStack_1f18 = auVar17._8_4_;
    fStack_1f14 = auVar17._12_4_;
    fStack_1f10 = auVar17._16_4_;
    fStack_1f0c = auVar17._20_4_;
    fStack_1f08 = auVar17._24_4_;
    local_1e00._4_4_ = fStack_1efc * fStack_1f1c;
    local_1e00._0_4_ = local_1f00 * local_1f20;
    fStack_1df8 = fStack_1ef8 * fStack_1f18;
    fStack_1df4 = fStack_1ef4 * fStack_1f14;
    uStack_1df0._0_4_ = fStack_1ef0 * fStack_1f10;
    uStack_1df0._4_4_ = fStack_1eec * fStack_1f0c;
    uStack_1de8._0_4_ = fStack_1ee8 * fStack_1f08;
    uStack_1de8._4_4_ = uStack_1ee4;
    auVar17 = _local_1e00;
    uStack_1de8 = auVar17._24_8_;
    auVar21._16_8_ = uStack_1df0;
    auVar21._0_16_ = _local_1e00;
    auVar21._24_8_ = uStack_1de8;
    auVar17._8_4_ = 0x42b0c0a5;
    auVar17._0_8_ = 0x42b0c0a542b0c0a5;
    auVar17._12_4_ = 0x42b0c0a5;
    auVar17._16_4_ = 0x42b0c0a5;
    auVar17._20_4_ = 0x42b0c0a5;
    auVar17._24_4_ = 0x42b0c0a5;
    auVar17._28_4_ = 0x42b0c0a5;
    auVar17 = vminps_avx(auVar21,auVar17);
    auVar147._8_4_ = 0xc2b0c0a5;
    auVar147._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar147._12_4_ = 0xc2b0c0a5;
    auVar147._16_4_ = 0xc2b0c0a5;
    auVar147._20_4_ = 0xc2b0c0a5;
    auVar147._24_4_ = 0xc2b0c0a5;
    auVar147._28_4_ = 0xc2b0c0a5;
    auVar147 = vmaxps_avx(auVar17,auVar147);
    auVar79._8_4_ = 1.442695;
    auVar79._12_4_ = 1.442695;
    auVar79._0_4_ = 1.442695;
    auVar79._4_4_ = 1.442695;
    auVar79._16_4_ = 1.442695;
    auVar79._20_4_ = 1.442695;
    auVar79._24_4_ = 1.442695;
    auVar79._28_4_ = 1.442695;
    auVar78._8_4_ = 0.5;
    auVar78._12_4_ = 0.5;
    auVar78._0_4_ = 0.5;
    auVar78._4_4_ = 0.5;
    auVar78._16_4_ = 0.5;
    auVar78._20_4_ = 0.5;
    auVar78._24_4_ = 0.5;
    auVar78._28_4_ = 0.5;
    auVar25 = vfmadd213ps_fma(auVar79,auVar147,auVar78);
    auVar21 = vroundps_avx(ZEXT1632(auVar25),1);
    auVar17 = vcmpps_avx(ZEXT1632(auVar25),auVar21,1);
    auVar77._8_8_ = 0x3f8000003f800000;
    auVar77._0_8_ = 0x3f8000003f800000;
    auVar77._16_8_ = 0x3f8000003f800000;
    auVar77._24_8_ = 0x3f8000003f800000;
    auVar17 = vpand_avx2(auVar17,auVar77);
    auVar17 = vsubps_avx(auVar21,auVar17);
    auVar95._8_4_ = 0.6933594;
    auVar95._12_4_ = 0.6933594;
    auVar95._0_4_ = 0.6933594;
    auVar95._4_4_ = 0.6933594;
    auVar95._16_4_ = 0.6933594;
    auVar95._20_4_ = 0.6933594;
    auVar95._24_4_ = 0.6933594;
    auVar95._28_4_ = 0.6933594;
    auVar25 = vfnmadd213ps_fma(auVar95,auVar17,auVar147);
    auVar96._8_4_ = -0.00021219444;
    auVar96._12_4_ = -0.00021219444;
    auVar96._0_4_ = -0.00021219444;
    auVar96._4_4_ = -0.00021219444;
    auVar96._16_4_ = -0.00021219444;
    auVar96._20_4_ = -0.00021219444;
    auVar96._24_4_ = -0.00021219444;
    auVar96._28_4_ = -0.00021219444;
    auVar25 = vfnmadd213ps_fma(auVar96,auVar17,ZEXT1632(auVar25));
    auVar147 = ZEXT1632(auVar25);
    local_1d00 = auVar25._0_4_;
    fStack_1cfc = auVar25._4_4_;
    fStack_1cf8 = auVar25._8_4_;
    fStack_1cf4 = auVar25._12_4_;
    _local_1e20 = ZEXT1632(CONCAT412(fStack_1cf4 * fStack_1cf4,
                                     CONCAT48(fStack_1cf8 * fStack_1cf8,
                                              CONCAT44(fStack_1cfc * fStack_1cfc,
                                                       local_1d00 * local_1d00))));
    uStack_1eb8._0_4_ = 0x39506967;
    local_1ec0 = (undefined1  [8])0x3950696739506967;
    uStack_1eb8._4_4_ = 0x39506967;
    uStack_1eb0._0_4_ = 0x39506967;
    uStack_1eb0._4_4_ = 0x39506967;
    uStack_1ea8._0_4_ = 0x39506967;
    uStack_1ea8._4_4_ = 0x39506967;
    auVar80._8_4_ = 0.0013981999;
    auVar80._12_4_ = 0.0013981999;
    auVar80._0_4_ = 0.0013981999;
    auVar80._4_4_ = 0.0013981999;
    auVar80._16_4_ = 0.0013981999;
    auVar80._20_4_ = 0.0013981999;
    auVar80._24_4_ = 0.0013981999;
    auVar80._28_4_ = 0.0013981999;
    auVar25 = vfmadd213ps_fma(auVar147,_local_1ec0,auVar80);
    auVar81._8_4_ = 0.008333452;
    auVar81._12_4_ = 0.008333452;
    auVar81._0_4_ = 0.008333452;
    auVar81._4_4_ = 0.008333452;
    auVar81._16_4_ = 0.008333452;
    auVar81._20_4_ = 0.008333452;
    auVar81._24_4_ = 0.008333452;
    auVar81._28_4_ = 0.008333452;
    auVar25 = vfmadd213ps_fma(auVar147,ZEXT1632(auVar25),auVar81);
    auVar82._8_4_ = 0.041665796;
    auVar82._12_4_ = 0.041665796;
    auVar82._0_4_ = 0.041665796;
    auVar82._4_4_ = 0.041665796;
    auVar82._16_4_ = 0.041665796;
    auVar82._20_4_ = 0.041665796;
    auVar82._24_4_ = 0.041665796;
    auVar82._28_4_ = 0.041665796;
    auVar25 = vfmadd213ps_fma(auVar147,ZEXT1632(auVar25),auVar82);
    auVar83._8_4_ = 0.16666666;
    auVar83._12_4_ = 0.16666666;
    auVar83._0_4_ = 0.16666666;
    auVar83._4_4_ = 0.16666666;
    auVar83._16_4_ = 0.16666666;
    auVar83._20_4_ = 0.16666666;
    auVar83._24_4_ = 0.16666666;
    auVar83._28_4_ = 0.16666666;
    auVar25 = vfmadd213ps_fma(auVar147,ZEXT1632(auVar25),auVar83);
    auVar84._8_4_ = 0.5;
    auVar84._12_4_ = 0.5;
    auVar84._0_4_ = 0.5;
    auVar84._4_4_ = 0.5;
    auVar84._16_4_ = 0.5;
    auVar84._20_4_ = 0.5;
    auVar84._24_4_ = 0.5;
    auVar84._28_4_ = 0.5;
    auVar25 = vfmadd213ps_fma(auVar147,ZEXT1632(auVar25),auVar84);
    auVar25 = vfmadd213ps_fma(_local_1e20,ZEXT1632(auVar25),auVar147);
    local_1dc0 = auVar25._0_4_;
    fStack_1dbc = auVar25._4_4_;
    fStack_1db8 = auVar25._8_4_;
    fStack_1db4 = auVar25._12_4_;
    local_15c0 = auVar17._0_4_;
    fStack_15bc = auVar17._4_4_;
    fStack_15b8 = auVar17._8_4_;
    fStack_15b4 = auVar17._12_4_;
    fStack_15b0 = auVar17._16_4_;
    fStack_15ac = auVar17._20_4_;
    fStack_15a8 = auVar17._24_4_;
    fStack_15a4 = auVar17._28_4_;
    local_1e60._4_4_ = (int)fStack_15bc;
    local_1e60._0_4_ = (int)local_15c0;
    local_1e60._8_4_ = (int)fStack_15b8;
    local_1e60._12_4_ = (int)fStack_15b4;
    uStack_1e50._0_4_ = (int)fStack_15b0;
    uStack_1e50._4_4_ = (int)fStack_15ac;
    uStack_1e48._0_4_ = (int)fStack_15a8;
    uStack_1e48._4_4_ = (int)fStack_15a4;
    auVar17 = _local_1e60;
    uStack_1e48 = auVar17._24_8_;
    auVar99._16_8_ = uStack_1e50;
    auVar99._0_16_ = local_1e60;
    auVar99._24_8_ = uStack_1e48;
    auVar98._8_8_ = 0x7f0000007f;
    auVar98._0_8_ = 0x7f0000007f;
    auVar98._16_8_ = 0x7f0000007f;
    auVar98._24_8_ = 0x7f0000007f;
    auVar17 = vpaddd_avx2(auVar99,auVar98);
    auVar17 = vpslld_avx2(auVar17,ZEXT416(0x17));
    local_1d60 = auVar17._0_4_;
    fStack_1d5c = auVar17._4_4_;
    fStack_1d58 = auVar17._8_4_;
    fStack_1d54 = auVar17._12_4_;
    fStack_1d50 = auVar17._16_4_;
    fStack_1d4c = auVar17._20_4_;
    fStack_1d48 = auVar17._24_4_;
    local_1ec0._4_4_ = (fStack_1dbc + 1.0) * fStack_1d5c;
    local_1ec0._0_4_ = (local_1dc0 + 1.0) * local_1d60;
    uStack_1eb8._0_4_ = (fStack_1db8 + 1.0) * fStack_1d58;
    uStack_1eb8._4_4_ = (fStack_1db4 + 1.0) * fStack_1d54;
    uStack_1eb0._0_4_ = fStack_1d50 * 1.0;
    uStack_1eb0._4_4_ = fStack_1d4c * 1.0;
    auVar140 = _local_1ec0;
    uStack_1ea8._0_4_ = fStack_1d48 * 1.0;
    uStack_1ea8._4_4_ = 0x3f800000;
    auVar17 = _local_1ec0;
    uStack_1eb0 = auVar140._16_8_;
    uStack_1ea8 = auVar17._24_8_;
    *local_45e0 = local_1ec0;
    local_45e0[1] = uStack_1eb8;
    local_45e0[2] = uStack_1eb0;
    local_45e0[3] = uStack_1ea8;
    local_45d0 = (undefined1 (*) [64])(*local_45d0 + 0x20);
    local_45e0 = local_45e0 + 4;
  }
  fVar1 = *in_RSI;
  for (; local_45f4 + 3 < iVar141; local_45f4 = local_45f4 + 4) {
    auVar18 = vcmpps_avx(*(undefined1 (*) [16])*local_45d0,ZEXT816(0),2);
    auVar20._8_4_ = 0x800000;
    auVar20._0_8_ = 0x80000000800000;
    auVar20._12_4_ = 0x800000;
    auVar19 = vmaxps_avx(*(undefined1 (*) [16])*local_45d0,auVar20);
    auVar25 = vpsrld_avx(auVar19,ZEXT416(0x17));
    auVar107._8_4_ = 0x807fffff;
    auVar107._0_8_ = 0x807fffff807fffff;
    auVar107._12_4_ = 0x807fffff;
    auVar19 = vpand_avx(auVar19,auVar107);
    auVar129._8_4_ = 0x3f000000;
    auVar129._0_8_ = 0x3f0000003f000000;
    auVar129._12_4_ = 0x3f000000;
    auVar20 = vpor_avx(auVar19,auVar129);
    auVar130._8_8_ = 0x7f0000007f;
    auVar130._0_8_ = 0x7f0000007f;
    auVar19 = vpsubd_avx(auVar25,auVar130);
    auVar19 = vcvtdq2ps_avx(auVar19);
    local_8a0 = auVar19._0_4_;
    fStack_89c = auVar19._4_4_;
    fStack_898 = auVar19._8_4_;
    fStack_894 = auVar19._12_4_;
    local_940 = CONCAT44(fStack_89c + 1.0,local_8a0 + 1.0);
    uStack_938._0_4_ = fStack_898 + 1.0;
    uStack_938._4_4_ = fStack_894 + 1.0;
    auVar131._8_4_ = 0x3f3504f3;
    auVar131._0_8_ = 0x3f3504f33f3504f3;
    auVar131._12_4_ = 0x3f3504f3;
    auVar19 = vcmpps_avx(auVar20,auVar131,1);
    auVar25 = vpand_avx(auVar20,auVar19);
    auVar103._8_8_ = 0x3f8000003f800000;
    auVar103._0_8_ = 0x3f8000003f800000;
    auVar20 = vsubps_avx(auVar20,auVar103);
    auVar106._8_8_ = 0x3f8000003f800000;
    auVar106._0_8_ = 0x3f8000003f800000;
    auVar19 = vpand_avx(auVar106,auVar19);
    auVar102._8_8_ = uStack_938;
    auVar102._0_8_ = local_940;
    auVar19 = vsubps_avx(auVar102,auVar19);
    local_8c0 = auVar20._0_4_;
    fStack_8bc = auVar20._4_4_;
    fStack_8b8 = auVar20._8_4_;
    fStack_8b4 = auVar20._12_4_;
    local_8d0 = auVar25._0_4_;
    fStack_8cc = auVar25._4_4_;
    fStack_8c8 = auVar25._8_4_;
    fStack_8c4 = auVar25._12_4_;
    local_900._0_4_ = local_8c0 + local_8d0;
    local_900._4_4_ = fStack_8bc + fStack_8cc;
    fStack_8f8 = fStack_8b8 + fStack_8c8;
    fStack_8f4 = fStack_8b4 + fStack_8c4;
    fStack_978 = 0.070376836;
    local_980 = (undefined1  [8])0x3d9021bb3d9021bb;
    fStack_974 = 0.070376836;
    auVar119._8_4_ = -0.1151461;
    auVar119._12_4_ = -0.1151461;
    auVar119._0_4_ = -0.1151461;
    auVar119._4_4_ = -0.1151461;
    auVar25 = vfmadd213ps_fma(_local_900,_local_980,auVar119);
    auVar120._8_4_ = 0.116769984;
    auVar120._12_4_ = 0.116769984;
    auVar120._0_4_ = 0.116769984;
    auVar120._4_4_ = 0.116769984;
    auVar25 = vfmadd213ps_fma(_local_900,auVar25,auVar120);
    auVar121._8_4_ = -0.12420141;
    auVar121._12_4_ = -0.12420141;
    auVar121._0_4_ = -0.12420141;
    auVar121._4_4_ = -0.12420141;
    auVar25 = vfmadd213ps_fma(_local_900,auVar25,auVar121);
    auVar122._8_4_ = 0.14249323;
    auVar122._12_4_ = 0.14249323;
    auVar122._0_4_ = 0.14249323;
    auVar122._4_4_ = 0.14249323;
    auVar25 = vfmadd213ps_fma(_local_900,auVar25,auVar122);
    auVar123._8_4_ = -0.16668057;
    auVar123._12_4_ = -0.16668057;
    auVar123._0_4_ = -0.16668057;
    auVar123._4_4_ = -0.16668057;
    auVar25 = vfmadd213ps_fma(_local_900,auVar25,auVar123);
    auVar124._8_4_ = 0.20000714;
    auVar124._12_4_ = 0.20000714;
    auVar124._0_4_ = 0.20000714;
    auVar124._4_4_ = 0.20000714;
    auVar25 = vfmadd213ps_fma(_local_900,auVar25,auVar124);
    auVar125._8_4_ = -0.24999994;
    auVar125._12_4_ = -0.24999994;
    auVar125._0_4_ = -0.24999994;
    auVar125._4_4_ = -0.24999994;
    auVar25 = vfmadd213ps_fma(_local_900,auVar25,auVar125);
    auVar126._8_4_ = 0.3333333;
    auVar126._12_4_ = 0.3333333;
    auVar126._0_4_ = 0.3333333;
    auVar126._4_4_ = 0.3333333;
    auVar25 = vfmadd213ps_fma(_local_900,auVar25,auVar126);
    local_820 = auVar25._0_4_;
    fStack_81c = auVar25._4_4_;
    fStack_818 = auVar25._8_4_;
    fStack_814 = auVar25._12_4_;
    local_980._4_4_ =
         fStack_81c * (float)local_900._4_4_ * (float)local_900._4_4_ * (float)local_900._4_4_;
    local_980._0_4_ =
         local_820 * (float)local_900._0_4_ * (float)local_900._0_4_ * (float)local_900._0_4_;
    fStack_978 = fStack_818 * fStack_8f8 * fStack_8f8 * fStack_8f8;
    fStack_974 = fStack_814 * fStack_8f4 * fStack_8f4 * fStack_8f4;
    auVar127._8_4_ = -0.00021219444;
    auVar127._12_4_ = -0.00021219444;
    auVar127._0_4_ = -0.00021219444;
    auVar127._4_4_ = -0.00021219444;
    auVar25 = vfmadd213ps_fma(auVar127,auVar19,_local_980);
    auVar133._4_4_ = (float)local_900._4_4_ * (float)local_900._4_4_;
    auVar133._0_4_ = (float)local_900._0_4_ * (float)local_900._0_4_;
    auVar133._8_4_ = fStack_8f8 * fStack_8f8;
    auVar133._12_4_ = fStack_8f4 * fStack_8f4;
    auVar113._8_4_ = 0.5;
    auVar113._12_4_ = 0.5;
    auVar113._0_4_ = 0.5;
    auVar113._4_4_ = 0.5;
    auVar25 = vfnmadd213ps_fma(auVar113,auVar133,auVar25);
    local_8f0 = auVar25._0_4_;
    fStack_8ec = auVar25._4_4_;
    fStack_8e8 = auVar25._8_4_;
    fStack_8e4 = auVar25._12_4_;
    local_900._4_4_ = (float)local_900._4_4_ + fStack_8ec;
    local_900._0_4_ = (float)local_900._0_4_ + local_8f0;
    fStack_8f8 = fStack_8f8 + fStack_8e8;
    fStack_8f4 = fStack_8f4 + fStack_8e4;
    auVar128._8_4_ = 0.6933594;
    auVar128._12_4_ = 0.6933594;
    auVar128._0_4_ = 0.6933594;
    auVar128._4_4_ = 0.6933594;
    auVar19 = vfmadd213ps_fma(auVar128,auVar19,_local_900);
    auVar18 = vpor_avx(auVar19,auVar18);
    local_b20 = auVar18._0_4_;
    fStack_b1c = auVar18._4_4_;
    fStack_b18 = auVar18._8_4_;
    fStack_b14 = auVar18._12_4_;
    local_a90 = CONCAT44(fVar1 * fStack_b1c,fVar1 * local_b20);
    uStack_a88._0_4_ = fVar1 * fStack_b18;
    uStack_a88._4_4_ = fVar1 * fStack_b14;
    auVar25._8_8_ = uStack_a88;
    auVar25._0_8_ = local_a90;
    auVar18._8_4_ = 0x42b0c0a5;
    auVar18._0_8_ = 0x42b0c0a542b0c0a5;
    auVar18._12_4_ = 0x42b0c0a5;
    auVar18 = vminps_avx(auVar25,auVar18);
    auVar19._8_4_ = 0xc2b0c0a5;
    auVar19._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar19._12_4_ = 0xc2b0c0a5;
    auVar25 = vmaxps_avx(auVar18,auVar19);
    local_9d0 = auVar25._0_4_;
    fStack_9cc = auVar25._4_4_;
    fStack_9c8 = auVar25._8_4_;
    fStack_9c4 = auVar25._12_4_;
    fVar146 = local_9d0 * 1.442695 + 0.5;
    fVar148 = fStack_9cc * 1.442695 + 0.5;
    fVar149 = fStack_9c8 * 1.442695 + 0.5;
    fVar150 = fStack_9c4 * 1.442695 + 0.5;
    local_ab0 = CONCAT44(fVar148,fVar146);
    uStack_aa8._0_4_ = fVar149;
    uStack_aa8._4_4_ = fVar150;
    local_ac0 = CONCAT44((int)fVar148,(int)fVar146);
    uStack_ab8._0_4_ = (int)fVar149;
    uStack_ab8._4_4_ = (int)fVar150;
    auVar104._8_8_ = uStack_ab8;
    auVar104._0_8_ = local_ac0;
    auVar19 = vcvtdq2ps_avx(auVar104);
    auVar105._8_8_ = uStack_aa8;
    auVar105._0_8_ = local_ab0;
    auVar18 = vcmpps_avx(auVar105,auVar19,1);
    auVar108._8_8_ = 0x3f8000003f800000;
    auVar108._0_8_ = 0x3f8000003f800000;
    auVar18 = vpand_avx(auVar18,auVar108);
    auVar18 = vsubps_avx(auVar19,auVar18);
    auVar111._8_4_ = 0.6933594;
    auVar111._12_4_ = 0.6933594;
    auVar111._0_4_ = 0.6933594;
    auVar111._4_4_ = 0.6933594;
    auVar19 = vfnmadd213ps_fma(auVar111,auVar18,auVar25);
    auVar112._8_4_ = -0.00021219444;
    auVar112._12_4_ = -0.00021219444;
    auVar112._0_4_ = -0.00021219444;
    auVar112._4_4_ = -0.00021219444;
    auVar25 = vfnmadd213ps_fma(auVar112,auVar18,auVar19);
    local_9f0 = auVar25._0_4_;
    fStack_9ec = auVar25._4_4_;
    fStack_9e8 = auVar25._8_4_;
    fStack_9e4 = auVar25._12_4_;
    local_aa0._4_4_ = fStack_9ec * fStack_9ec;
    local_aa0._0_4_ = local_9f0 * local_9f0;
    fStack_a98 = fStack_9e8 * fStack_9e8;
    fStack_a94 = fStack_9e4 * fStack_9e4;
    uStack_ae8._0_4_ = 0x39506967;
    local_af0 = (undefined1  [8])0x3950696739506967;
    uStack_ae8._4_4_ = 0x39506967;
    auVar114._8_4_ = 0.0013981999;
    auVar114._12_4_ = 0.0013981999;
    auVar114._0_4_ = 0.0013981999;
    auVar114._4_4_ = 0.0013981999;
    auVar19 = vfmadd213ps_fma(auVar25,_local_af0,auVar114);
    auVar115._8_4_ = 0.008333452;
    auVar115._12_4_ = 0.008333452;
    auVar115._0_4_ = 0.008333452;
    auVar115._4_4_ = 0.008333452;
    auVar19 = vfmadd213ps_fma(auVar25,auVar19,auVar115);
    auVar116._8_4_ = 0.041665796;
    auVar116._12_4_ = 0.041665796;
    auVar116._0_4_ = 0.041665796;
    auVar116._4_4_ = 0.041665796;
    auVar19 = vfmadd213ps_fma(auVar25,auVar19,auVar116);
    auVar117._8_4_ = 0.16666666;
    auVar117._12_4_ = 0.16666666;
    auVar117._0_4_ = 0.16666666;
    auVar117._4_4_ = 0.16666666;
    auVar19 = vfmadd213ps_fma(auVar25,auVar19,auVar117);
    auVar118._8_4_ = 0.5;
    auVar118._12_4_ = 0.5;
    auVar118._0_4_ = 0.5;
    auVar118._4_4_ = 0.5;
    auVar19 = vfmadd213ps_fma(auVar25,auVar19,auVar118);
    auVar19 = vfmadd213ps_fma(_local_aa0,auVar19,auVar25);
    local_a70 = auVar19._0_4_;
    fStack_a6c = auVar19._4_4_;
    fStack_a68 = auVar19._8_4_;
    fStack_a64 = auVar19._12_4_;
    local_7b0 = auVar18._0_4_;
    fStack_7ac = auVar18._4_4_;
    fStack_7a8 = auVar18._8_4_;
    fStack_7a4 = auVar18._12_4_;
    local_ac0 = CONCAT44((int)fStack_7ac,(int)local_7b0);
    uStack_ab8._0_4_ = (int)fStack_7a8;
    uStack_ab8._4_4_ = (int)fStack_7a4;
    auVar110._8_8_ = uStack_ab8;
    auVar110._0_8_ = local_ac0;
    auVar109._8_8_ = 0x7f0000007f;
    auVar109._0_8_ = 0x7f0000007f;
    auVar18 = vpaddd_avx(auVar110,auVar109);
    auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
    local_a20 = auVar18._0_4_;
    fStack_a1c = auVar18._4_4_;
    fStack_a18 = auVar18._8_4_;
    fStack_a14 = auVar18._12_4_;
    local_af0._4_4_ = (fStack_a6c + 1.0) * fStack_a1c;
    local_af0._0_4_ = (local_a70 + 1.0) * local_a20;
    uStack_ae8._0_4_ = (fStack_a68 + 1.0) * fStack_a18;
    uStack_ae8._4_4_ = (fStack_a64 + 1.0) * fStack_a14;
    *local_45e0 = local_af0;
    local_45e0[1] = uStack_ae8;
    local_45d0 = (undefined1 (*) [64])(*local_45d0 + 0x10);
    local_45e0 = local_45e0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}